

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

int * Wlc_VecCopy(Vec_Int_t *vOut,int *pArray,int nSize)

{
  ulong uVar1;
  ulong uVar2;
  
  vOut->nSize = 0;
  uVar2 = 0;
  uVar1 = (ulong)(uint)nSize;
  if (nSize < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    Vec_IntPush(vOut,pArray[uVar2]);
  }
  return vOut->pArray;
}

Assistant:

int * Wlc_VecCopy( Vec_Int_t * vOut, int * pArray, int nSize )
{
    int i; Vec_IntClear( vOut );
    for( i = 0; i < nSize; i++) 
        Vec_IntPush( vOut, pArray[i] );
    return Vec_IntArray( vOut );
}